

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::ButtonBehavior
               (ImRect *bb,ImGuiID id,bool *out_hovered,bool *out_held,ImGuiButtonFlags flags)

{
  ImGuiContext *pIVar1;
  byte bVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  ImGuiWindow *window_00;
  ImGuiWindow *in_RCX;
  byte *in_RDX;
  ImGuiID in_ESI;
  uint in_R8D;
  byte bVar6;
  ImVec2 IVar7;
  bool held;
  bool nav_activated_by_inputs;
  bool nav_activated_by_code;
  bool hovered;
  bool pressed;
  ImGuiWindow *backup_hovered_window;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImVec2 *in_stack_ffffffffffffffa8;
  ImGuiHoveredFlags in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb4;
  undefined1 in_stack_ffffffffffffffb5;
  undefined1 in_stack_ffffffffffffffb6;
  byte bVar8;
  ImGuiWindow *bb_00;
  undefined1 repeat;
  uint local_2c;
  bool local_1;
  
  pIVar1 = GImGui;
  window_00 = GetCurrentWindow();
  if ((in_R8D & 0x100) == 0) {
    local_2c = in_R8D;
    if ((in_R8D & 0x1e) == 0) {
      local_2c = in_R8D | 2;
    }
    bb_00 = pIVar1->HoveredWindow;
    if (((local_2c & 0x20) != 0) && (pIVar1->HoveredRootWindow == window_00)) {
      pIVar1->HoveredWindow = window_00;
    }
    bVar8 = 0;
    bVar2 = ItemHoverable((ImRect *)bb_00,
                          (uint)CONCAT12(in_stack_ffffffffffffffb6,
                                         CONCAT11(in_stack_ffffffffffffffb5,
                                                  in_stack_ffffffffffffffb4)));
    if (((((bool)bVar2) && ((pIVar1->DragDropActive & 1U) != 0)) &&
        ((pIVar1->DragDropPayload).SourceId == in_ESI)) && ((pIVar1->DragDropSourceFlags & 2U) == 0)
       ) {
      bVar2 = false;
    }
    if ((((pIVar1->DragDropActive & 1U) != 0) && ((local_2c & 0x1000) != 0)) &&
       (((pIVar1->DragDropSourceFlags & 4U) == 0 &&
        (bVar3 = IsItemHovered(in_stack_ffffffffffffffb0), bVar3)))) {
      bVar2 = 1;
      SetHoveredID(in_ESI);
      iVar5 = CalcTypematicPressedRepeatAmount
                        (pIVar1->HoveredIdTimer + 0.0001,
                         (pIVar1->HoveredIdTimer + 0.0001) - (pIVar1->IO).DeltaTime,0.01,0.7);
      if (iVar5 != 0) {
        bVar8 = 1;
        FocusWindow((ImGuiWindow *)
                    CONCAT17(1,CONCAT16(bVar2,CONCAT15(in_stack_ffffffffffffffb5,
                                                       CONCAT14(in_stack_ffffffffffffffb4,
                                                                in_stack_ffffffffffffffb0)))));
      }
    }
    if (((local_2c & 0x20) != 0) && (pIVar1->HoveredRootWindow == window_00)) {
      pIVar1->HoveredWindow = bb_00;
    }
    if (((((bVar2 & 1) != 0) && ((local_2c & 0x40) != 0)) &&
        (pIVar1->HoveredIdPreviousFrame != in_ESI)) && (pIVar1->HoveredIdPreviousFrame != 0)) {
      bVar2 = 0;
    }
    if ((bVar2 & 1) != 0) {
      if (((local_2c & 0x400) == 0) ||
         (((((pIVar1->IO).KeyCtrl & 1U) == 0 && (((pIVar1->IO).KeyShift & 1U) == 0)) &&
          (((pIVar1->IO).KeyAlt & 1U) == 0)))) {
        if (((local_2c & 2) != 0) && (((pIVar1->IO).MouseClicked[0] & 1U) != 0)) {
          SetActiveID(in_ESI,window_00);
          if ((local_2c & 0x2000) == 0) {
            SetFocusID((ImGuiID)((ulong)in_RDX >> 0x20),in_RCX);
          }
          FocusWindow((ImGuiWindow *)
                      CONCAT17(bVar8,CONCAT16(bVar2,CONCAT15(in_stack_ffffffffffffffb5,
                                                             CONCAT14(in_stack_ffffffffffffffb4,
                                                                      in_stack_ffffffffffffffb0)))))
          ;
        }
        repeat = (undefined1)((ulong)bb_00 >> 0x38);
        if ((((local_2c & 4) != 0) && (((pIVar1->IO).MouseClicked[0] & 1U) != 0)) ||
           (((local_2c & 0x10) != 0 && (((pIVar1->IO).MouseDoubleClicked[0] & 1U) != 0)))) {
          bVar8 = 1;
          if ((local_2c & 0x800) == 0) {
            SetActiveID(in_ESI,window_00);
          }
          else {
            ClearActiveID();
          }
          FocusWindow((ImGuiWindow *)
                      CONCAT17(bVar8,CONCAT16(bVar2,CONCAT15(in_stack_ffffffffffffffb5,
                                                             CONCAT14(in_stack_ffffffffffffffb4,
                                                                      in_stack_ffffffffffffffb0)))))
          ;
        }
        if (((local_2c & 8) != 0) && (((pIVar1->IO).MouseReleased[0] & 1U) != 0)) {
          if (((local_2c & 1) == 0) ||
             ((pIVar1->IO).MouseDownDurationPrev[0] < (pIVar1->IO).KeyRepeatDelay)) {
            bVar8 = 1;
          }
          ClearActiveID();
        }
        if (((((local_2c & 1) != 0) && (pIVar1->ActiveId == in_ESI)) &&
            (0.0 < (pIVar1->IO).MouseDownDuration[0])) &&
           (bVar3 = IsMouseClicked((int)window_00,(bool)repeat), bVar3)) {
          bVar8 = 1;
        }
      }
      if ((bVar8 & 1) != 0) {
        pIVar1->NavDisableHighlight = true;
      }
    }
    if ((((pIVar1->NavId == in_ESI) && ((pIVar1->NavDisableHighlight & 1U) == 0)) &&
        ((pIVar1->NavDisableMouseHover & 1U) != 0)) &&
       (((pIVar1->ActiveId == 0 || (pIVar1->ActiveId == in_ESI)) ||
        (pIVar1->ActiveId == window_00->MoveId)))) {
      bVar2 = 1;
    }
    if (pIVar1->NavActivateDownId == in_ESI) {
      bVar6 = pIVar1->NavActivateId == in_ESI;
      bVar4 = IsNavInputPressed(0,0x175dfe);
      if (((bVar6 & 1) != 0) || ((bool)bVar4)) {
        bVar8 = 1;
      }
      if ((((bVar6 & 1) != 0) || ((bool)bVar4)) || (pIVar1->ActiveId == in_ESI)) {
        pIVar1->NavActivateId = in_ESI;
        SetActiveID(in_ESI,window_00);
        if ((((bVar6 & 1) != 0) || ((bVar4 & 1) != 0)) && ((local_2c & 0x2000) == 0)) {
          SetFocusID((ImGuiID)((ulong)in_RDX >> 0x20),in_RCX);
        }
        pIVar1->ActiveIdAllowNavDirFlags = 0xf;
      }
    }
    bVar4 = 0;
    if (pIVar1->ActiveId == in_ESI) {
      if (pIVar1->ActiveIdSource == ImGuiInputSource_Mouse) {
        bVar4 = 0;
        if ((pIVar1->ActiveIdIsJustActivated & 1U) != 0) {
          bVar4 = 0;
          IVar7 = operator-(in_stack_ffffffffffffffa8,(ImVec2 *)0x175ede);
          pIVar1->ActiveIdClickOffset = IVar7;
        }
        if (((pIVar1->IO).MouseDown[0] & 1U) == 0) {
          if ((((bVar2 & 1) != 0) && ((local_2c & 2) != 0)) &&
             ((((local_2c & 1) == 0 ||
               ((pIVar1->IO).MouseDownDurationPrev[0] < (pIVar1->IO).KeyRepeatDelay)) &&
              ((pIVar1->DragDropActive & 1U) == 0)))) {
            bVar8 = 1;
          }
          ClearActiveID();
        }
        else {
          bVar4 = 1;
        }
        if ((local_2c & 0x2000) == 0) {
          pIVar1->NavDisableHighlight = true;
        }
      }
      else {
        bVar4 = 0;
        if ((pIVar1->ActiveIdSource == ImGuiInputSource_Nav) &&
           (bVar4 = 0, pIVar1->NavActivateDownId != in_ESI)) {
          bVar4 = 0;
          ClearActiveID();
        }
      }
    }
    if (in_RDX != (byte *)0x0) {
      *in_RDX = bVar2 & 1;
    }
    if (in_RCX != (ImGuiWindow *)0x0) {
      *(byte *)&in_RCX->Name = bVar4 & 1;
    }
    local_1 = (bool)(bVar8 & 1);
  }
  else {
    if (in_RDX != (byte *)0x0) {
      *in_RDX = 0;
    }
    if (in_RCX != (ImGuiWindow *)0x0) {
      *(undefined1 *)&in_RCX->Name = 0;
    }
    if (pIVar1->ActiveId == in_ESI) {
      ClearActiveID();
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::ButtonBehavior(const ImRect& bb, ImGuiID id, bool* out_hovered, bool* out_held, ImGuiButtonFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    if (flags & ImGuiButtonFlags_Disabled)
    {
        if (out_hovered) *out_hovered = false;
        if (out_held) *out_held = false;
        if (g.ActiveId == id) ClearActiveID();
        return false;
    }

    // Default behavior requires click+release on same spot
    if ((flags & (ImGuiButtonFlags_PressedOnClickRelease | ImGuiButtonFlags_PressedOnClick | ImGuiButtonFlags_PressedOnRelease | ImGuiButtonFlags_PressedOnDoubleClick)) == 0)
        flags |= ImGuiButtonFlags_PressedOnClickRelease;

    ImGuiWindow* backup_hovered_window = g.HoveredWindow;
    if ((flags & ImGuiButtonFlags_FlattenChildren) && g.HoveredRootWindow == window)
        g.HoveredWindow = window;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    if (id != 0 && window->DC.LastItemId != id)
        ImGuiTestEngineHook_ItemAdd(&g, bb, id);
#endif

    bool pressed = false;
    bool hovered = ItemHoverable(bb, id);

    // Drag source doesn't report as hovered
    if (hovered && g.DragDropActive && g.DragDropPayload.SourceId == id && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoDisableHover))
        hovered = false;

    // Special mode for Drag and Drop where holding button pressed for a long time while dragging another item triggers the button
    if (g.DragDropActive && (flags & ImGuiButtonFlags_PressedOnDragDropHold) && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoHoldToOpenOthers))
        if (IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByActiveItem))
        {
            hovered = true;
            SetHoveredID(id);
            if (CalcTypematicPressedRepeatAmount(g.HoveredIdTimer + 0.0001f, g.HoveredIdTimer + 0.0001f - g.IO.DeltaTime, 0.01f, 0.70f)) // FIXME: Our formula for CalcTypematicPressedRepeatAmount() is fishy
            {
                pressed = true;
                FocusWindow(window);
            }
        }

    if ((flags & ImGuiButtonFlags_FlattenChildren) && g.HoveredRootWindow == window)
        g.HoveredWindow = backup_hovered_window;

    // AllowOverlap mode (rarely used) requires previous frame HoveredId to be null or to match. This allows using patterns where a later submitted widget overlaps a previous one.
    if (hovered && (flags & ImGuiButtonFlags_AllowItemOverlap) && (g.HoveredIdPreviousFrame != id && g.HoveredIdPreviousFrame != 0))
        hovered = false;

    // Mouse
    if (hovered)
    {
        if (!(flags & ImGuiButtonFlags_NoKeyModifiers) || (!g.IO.KeyCtrl && !g.IO.KeyShift && !g.IO.KeyAlt))
        {
            //                        | CLICKING        | HOLDING with ImGuiButtonFlags_Repeat
            // PressedOnClickRelease  |  <on release>*  |  <on repeat> <on repeat> .. (NOT on release)  <-- MOST COMMON! (*) only if both click/release were over bounds
            // PressedOnClick         |  <on click>     |  <on click> <on repeat> <on repeat> ..
            // PressedOnRelease       |  <on release>   |  <on repeat> <on repeat> .. (NOT on release)
            // PressedOnDoubleClick   |  <on dclick>    |  <on dclick> <on repeat> <on repeat> ..
            // FIXME-NAV: We don't honor those different behaviors.
            if ((flags & ImGuiButtonFlags_PressedOnClickRelease) && g.IO.MouseClicked[0])
            {
                SetActiveID(id, window);
                if (!(flags & ImGuiButtonFlags_NoNavFocus))
                    SetFocusID(id, window);
                FocusWindow(window);
            }
            if (((flags & ImGuiButtonFlags_PressedOnClick) && g.IO.MouseClicked[0]) || ((flags & ImGuiButtonFlags_PressedOnDoubleClick) && g.IO.MouseDoubleClicked[0]))
            {
                pressed = true;
                if (flags & ImGuiButtonFlags_NoHoldingActiveID)
                    ClearActiveID();
                else
                    SetActiveID(id, window); // Hold on ID
                FocusWindow(window);
            }
            if ((flags & ImGuiButtonFlags_PressedOnRelease) && g.IO.MouseReleased[0])
            {
                if (!((flags & ImGuiButtonFlags_Repeat) && g.IO.MouseDownDurationPrev[0] >= g.IO.KeyRepeatDelay))  // Repeat mode trumps <on release>
                    pressed = true;
                ClearActiveID();
            }

            // 'Repeat' mode acts when held regardless of _PressedOn flags (see table above).
            // Relies on repeat logic of IsMouseClicked() but we may as well do it ourselves if we end up exposing finer RepeatDelay/RepeatRate settings.
            if ((flags & ImGuiButtonFlags_Repeat) && g.ActiveId == id && g.IO.MouseDownDuration[0] > 0.0f && IsMouseClicked(0, true))
                pressed = true;
        }

        if (pressed)
            g.NavDisableHighlight = true;
    }

    // Gamepad/Keyboard navigation
    // We report navigated item as hovered but we don't set g.HoveredId to not interfere with mouse.
    if (g.NavId == id && !g.NavDisableHighlight && g.NavDisableMouseHover && (g.ActiveId == 0 || g.ActiveId == id || g.ActiveId == window->MoveId))
        hovered = true;

    if (g.NavActivateDownId == id)
    {
        bool nav_activated_by_code = (g.NavActivateId == id);
        bool nav_activated_by_inputs = IsNavInputPressed(ImGuiNavInput_Activate, (flags & ImGuiButtonFlags_Repeat) ? ImGuiInputReadMode_Repeat : ImGuiInputReadMode_Pressed);
        if (nav_activated_by_code || nav_activated_by_inputs)
            pressed = true;
        if (nav_activated_by_code || nav_activated_by_inputs || g.ActiveId == id)
        {
            // Set active id so it can be queried by user via IsItemActive(), equivalent of holding the mouse button.
            g.NavActivateId = id; // This is so SetActiveId assign a Nav source
            SetActiveID(id, window);
            if ((nav_activated_by_code || nav_activated_by_inputs) && !(flags & ImGuiButtonFlags_NoNavFocus))
                SetFocusID(id, window);
            g.ActiveIdAllowNavDirFlags = (1 << ImGuiDir_Left) | (1 << ImGuiDir_Right) | (1 << ImGuiDir_Up) | (1 << ImGuiDir_Down);
        }
    }

    bool held = false;
    if (g.ActiveId == id)
    {
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (g.ActiveIdIsJustActivated)
                g.ActiveIdClickOffset = g.IO.MousePos - bb.Min;
            if (g.IO.MouseDown[0])
            {
                held = true;
            }
            else
            {
                if (hovered && (flags & ImGuiButtonFlags_PressedOnClickRelease))
                    if (!((flags & ImGuiButtonFlags_Repeat) && g.IO.MouseDownDurationPrev[0] >= g.IO.KeyRepeatDelay))  // Repeat mode trumps <on release>
                        if (!g.DragDropActive)
                            pressed = true;
                ClearActiveID();
            }
            if (!(flags & ImGuiButtonFlags_NoNavFocus))
                g.NavDisableHighlight = true;
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            if (g.NavActivateDownId != id)
                ClearActiveID();
        }
    }

    if (out_hovered) *out_hovered = hovered;
    if (out_held) *out_held = held;

    return pressed;
}